

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.cxx
# Opt level: O0

int64_t nuraft::raft_server::get_stat_gauge(string *name)

{
  Type TVar1;
  stat_elem *this;
  stat_elem *elem;
  string *in_stack_00000030;
  stat_mgr *in_stack_00000038;
  undefined8 local_8;
  
  stat_mgr::get_instance();
  this = stat_mgr::get_stat(in_stack_00000038,in_stack_00000030);
  if (this == (stat_elem *)0x0) {
    local_8 = 0;
  }
  else {
    TVar1 = stat_elem::get_type(this);
    if (TVar1 == COUNTER) {
      local_8 = stat_elem::get_counter((stat_elem *)0x238118);
    }
    else {
      TVar1 = stat_elem::get_type(this);
      if (TVar1 == GAUGE) {
        local_8 = stat_elem::get_gauge((stat_elem *)0x238136);
      }
      else {
        local_8 = 0;
      }
    }
  }
  return local_8;
}

Assistant:

int64_t raft_server::get_stat_gauge(const std::string& name) {
    stat_elem* elem = stat_mgr::get_instance()->get_stat(name);
    if (!elem) return 0;
    // Tolerate type cast between counter and gauge.
    if (elem->get_type() == stat_elem::COUNTER) {
        return elem->get_counter();
    } else if (elem->get_type() == stat_elem::GAUGE) {
        return elem->get_gauge();
    }
    return 0;
}